

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf.c
# Opt level: O2

void latency_client(char *addr,size_t msgsize,int trips)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  char *fmt;
  float fVar6;
  undefined8 local_40;
  nng_msg *msg;
  nng_socket s;
  
  iVar1 = (*open_client)((nng_socket *)((long)&msg + 4));
  if (iVar1 != 0) goto LAB_00101db6;
  iVar1 = nng_dial(msg._4_4_,addr,0,0);
  if (iVar1 == 0) {
    nng_msleep(100);
    iVar1 = nng_msg_alloc(&local_40,msgsize);
    if (iVar1 == 0) {
      lVar3 = nng_clock();
      iVar1 = 0;
      if (0 < trips) {
        iVar1 = trips;
      }
      iVar1 = iVar1 + 1;
      do {
        iVar1 = iVar1 + -1;
        if (iVar1 == 0) {
          lVar5 = nng_clock();
          nng_msg_free(local_40);
          nng_socket_close(msg._4_4_);
          fVar6 = (float)(ulong)(lVar5 - lVar3) / 1000.0;
          printf("total time: %.3f [s]\n",(double)fVar6);
          printf("message size: %d [B]\n",msgsize & 0xffffffff);
          printf("round trip count: %d\n",(ulong)(uint)trips);
          printf("average latency: %.3f [us]\n",(double)((fVar6 * 1e+06) / (float)(trips * 2)));
          return;
        }
        iVar2 = nng_sendmsg(msg._4_4_,local_40,0);
        if (iVar2 != 0) {
          uVar4 = nng_strerror(iVar2);
          fmt = "nng_sendmsg: %s";
          goto LAB_00101dac;
        }
        iVar2 = nng_recvmsg(msg._4_4_,&local_40,0);
      } while (iVar2 == 0);
      uVar4 = nng_strerror(iVar2);
      fmt = "nng_recvmsg: %s";
    }
    else {
      uVar4 = nng_strerror(0);
      fmt = "nng_msg_alloc: %s";
    }
  }
  else {
    uVar4 = nng_strerror(iVar1);
    fmt = "nng_dial: %s";
  }
LAB_00101dac:
  do {
    die(fmt,uVar4);
    iVar1 = extraout_EAX;
LAB_00101db6:
    uVar4 = nng_strerror(iVar1);
    fmt = "nng_socket: %s";
  } while( true );
}

Assistant:

void
latency_client(const char *addr, size_t msgsize, int trips)
{
	nng_socket s;
	nng_msg   *msg;
	nng_time   start, end;
	int        rv;
	int        i;
	float      total;
	float      latency;
	if ((rv = open_client(&s)) != 0) {
		die("nng_socket: %s", nng_strerror(rv));
	}

	// XXX: set no delay
	// XXX: other options (TLS in the future?, Linger?)

	if ((rv = nng_dial(s, addr, NULL, 0)) != 0) {
		die("nng_dial: %s", nng_strerror(rv));
	}

	nng_msleep(100);

	if (nng_msg_alloc(&msg, msgsize) != 0) {
		die("nng_msg_alloc: %s", nng_strerror(rv));
	}

	start = nng_clock();
	for (i = 0; i < trips; i++) {
		if ((rv = nng_sendmsg(s, msg, 0)) != 0) {
			die("nng_sendmsg: %s", nng_strerror(rv));
		}

		if ((rv = nng_recvmsg(s, &msg, 0)) != 0) {
			die("nng_recvmsg: %s", nng_strerror(rv));
		}
	}
	end = nng_clock();

	nng_msg_free(msg);
	nng_socket_close(s);

	total   = (float) ((end - start)) / 1000;
	latency = ((float) ((total * 1000000)) / (float) (trips * 2));
	printf("total time: %.3f [s]\n", total);
	printf("message size: %d [B]\n", (int) msgsize);
	printf("round trip count: %d\n", trips);
	printf("average latency: %.3f [us]\n", latency);
}